

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

bool genVulkanFunctionsPC
               (QList<VkSpecParser::Command> *commands,
               QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
               QString *outputBase)

{
  uint a;
  uint uVar1;
  char cVar2;
  bool bVar3;
  QString *pQVar4;
  char *className;
  Data *pDVar5;
  Command *c;
  Command *c_00;
  long lVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  QString *key;
  QStringBuilder<const_QString_&,_QString> *pQVar10;
  QArrayDataPointer<char16_t> *pQVar11;
  long in_FS_OFFSET;
  uint local_19c;
  uint local_198;
  uint local_194;
  ulong local_190;
  QArrayDataPointer<char> local_160;
  QArrayDataPointer<char> local_148;
  QArrayDataPointer<char16_t> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_100;
  QArrayDataPointer<QString> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QStringBuilder<const_QString_&,_QString> local_88;
  QStringBuilder<const_QString_&,_QString> local_68;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_c8.size = 0;
  local_a8.d = (Data *)0x0;
  local_88.b.d.d._0_4_ = 0;
  local_88.b.d.d._4_4_ = 0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  local_88.b.d.ptr._0_4_ = 0x10a1d4;
  local_88.b.d.ptr._4_4_ = 0;
  local_88.b.d.size = 6;
  local_88.a = outputBase;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>((QString *)&local_68,&local_88);
  QFile::QFile((QFile *)&local_48,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  cVar2 = QFile::open((QFile *)&local_48,0x12);
  if (cVar2 == '\0') {
    local_88.a._0_4_ = 2;
    local_88.b.d.ptr._4_4_ = 0;
    local_88.a._4_4_ = 0;
    local_88.b.d.d._0_4_ = 0;
    local_88.b.d.d._4_4_ = 0;
    local_88.b.d.ptr._0_4_ = 0;
    local_88.b.d.size = 0x10ab99;
    QFile::fileName();
    QString::toLocal8Bit((QByteArray *)&local_68,(QString *)&local_a8);
    pDVar5 = local_68.b.d.d;
    if (local_68.b.d.d == (Data *)0x0) {
      pDVar5 = (Data *)&QByteArray::_empty;
    }
    QMessageLogger::warning((char *)&local_88,"Failed to write %s",pDVar5);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  else {
    local_88.a._0_4_ = 0;
    local_88.a._4_4_ = 0;
    local_88.b.d.d._0_4_ = 0;
    local_88.b.d.d._4_4_ = 0;
    local_88.b.d.ptr._0_4_ = 0;
    local_88.b.d.ptr._4_4_ = 0;
    local_68.a = (QString *)0x0;
    local_68.b.d.d = (Data *)0x0;
    local_68.b.d.ptr = (char16_t *)0x0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (char16_t *)0x0;
    local_c8.size = 0;
    pQVar4 = VERSIONS.d.ptr + VERSIONS.d.size;
    local_194 = 0;
    local_198 = 0;
    local_19c = 0;
    local_190 = 0;
    for (key = VERSIONS.d.ptr; key != pQVar4; key = key + 1) {
      QMap<QString,_QList<QString>_>::operator[]
                ((QList<QString> *)&local_e8,versionCommandMapping,key);
      local_100.d = (Data *)0x10aacb;
      local_100.size = 0x10ab00;
      local_100.ptr = (char16_t *)key;
      operator+=((QString *)&local_68,
                 (QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[2]>
                  *)&local_100);
      local_100.d = (Data *)0x10aacb;
      local_100.size = 0x10ab00;
      local_100.ptr = (char16_t *)key;
      operator+=((QString *)&local_88,
                 (QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[2]>
                  *)&local_100);
      c_00 = (commands->d).ptr;
      for (lVar6 = (commands->d).size * 0x68; lVar6 != 0; lVar6 = lVar6 + -0x68) {
        bVar3 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)&local_e8,(QString *)c_00,CaseSensitive);
        if (bVar3) {
          bVar3 = c_00->deviceLevel;
          a = local_194;
          if (bVar3 != false) {
            a = local_198;
          }
          pQVar10 = &local_68;
          if (bVar3 != false) {
            pQVar10 = &local_88;
          }
          className = "QVulkanFunctions";
          uVar1 = a + 1;
          if (bVar3 != false) {
            className = "QVulkanDeviceFunctions";
            local_198 = a + 1;
            uVar1 = local_194;
          }
          local_194 = uVar1;
          funcSig((QString *)&local_100,c_00,className);
          QString::append((QString *)pQVar10);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
          local_118.ptr = L"\n{\n    Q_ASSERT(d_ptr->m_funcs[%1]);\n    ";
          local_118.size = 0x29;
          local_118.d = (Data *)0x0;
          local_130.d = (Data *)0x0;
          local_130.ptr = (char16_t *)0x0;
          local_130.size = 0;
          QString::arg<int,_true>((QString *)&local_100,(QString *)&local_118,a,0,10,(QChar)0x20);
          QString::append((QString *)pQVar10);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
          funcCall((QString *)&local_100,c_00,a);
          QString::append((QString *)pQVar10);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
          local_100.ptr = L";\n}\n\n";
          local_100.size = 5;
          local_100.d = (Data *)0x0;
          local_118.d = (Data *)0x0;
          local_118.ptr = (char16_t *)0x0;
          local_118.size = 0;
          QString::append((QString *)pQVar10);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
          pQVar11 = &local_c8;
          if (c_00->deviceLevel != false) {
            pQVar11 = &local_a8;
          }
          local_118.d = (Data *)0x0;
          local_118.ptr = (char16_t *)0x0;
          local_100.d = (Data *)0x0;
          local_100.ptr = L"        \"";
          local_118.size = 0;
          local_100.size = 9;
          QString::append((QString *)pQVar11);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
          QString::append((QString *)pQVar11);
          local_118.d = (Data *)0x0;
          local_118.ptr = (char16_t *)0x0;
          local_100.d = (Data *)0x0;
          local_100.ptr = L"\",\n";
          local_118.size = 0;
          local_100.size = 3;
          QString::append((QString *)pQVar11);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        }
        c_00 = c_00 + 1;
      }
      local_118.d = (Data *)0x0;
      local_118.ptr = (char16_t *)0x0;
      local_100.d = (Data *)0x0;
      local_100.ptr = L"VK_VERSION_1_0";
      local_118.size = 0;
      local_100.size = 0xe;
      bVar3 = comparesEqual(key,(QString *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      if (bVar3) {
        local_190 = (ulong)local_198;
        local_19c = local_194;
      }
      QString::operator+=((QString *)&local_68,"#endif\n\n");
      QString::operator+=((QString *)&local_88,"#endif\n\n");
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
    }
    if (2 < (ulong)local_a8.size) {
      QString::chop((longlong)&local_a8);
    }
    if (2 < (ulong)local_c8.size) {
      QString::chop((longlong)&local_c8);
    }
    local_e8.size = -0x5555555555555556;
    local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    Preamble::get((QByteArray *)&local_100,&preamble,licHeaderFn);
    pcVar9 = local_100.ptr;
    if (local_100.ptr == (char16_t *)0x0) {
      pcVar9 = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper((QString *)&local_118);
    pcVar8 = local_118.ptr;
    if (local_118.ptr == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper((QString *)&local_130);
    pcVar7 = local_130.ptr;
    if (local_130.ptr == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper((QString *)&local_148);
    if (local_148.ptr == (char *)0x0) {
      local_148.ptr = (char *)&QByteArray::_empty;
    }
    QString::toUtf8_helper((QString *)&local_160);
    if (local_160.ptr == (char *)0x0) {
      local_160.ptr = (char *)&QByteArray::_empty;
    }
    QString::asprintf((char *)&local_e8,
                      "%s\n#include \"qvulkanfunctions_p.h\"\n#include \"qvulkaninstance.h\"\n\n#include <QtCore/private/qoffsetstringarray_p.h>\n\nQT_BEGIN_NAMESPACE\n\n%sQVulkanFunctionsPrivate::QVulkanFunctionsPrivate(QVulkanInstance *inst)\n{\n    static constexpr auto funcNames = qOffsetStringArray(\n%s\n    );\n    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n    for (int i = 0; i < funcNames.count(); ++i) {\n        m_funcs[i] = inst->getInstanceProcAddr(funcNames.at(i));\n        if (i < %d && !m_funcs[i])\n            qWarning(\"QVulkanFunctions: Failed to resolve %%s\", funcNames.at(i));\n    }\n}\n\n%sQVulkanDeviceFunctionsPrivate::QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device)\n{\n    QVulkanFunctions *f = inst->functions();\n    Q_ASSERT(f);\n\n    static constexpr auto funcNames = qOffsetStringArray(\n%s\n    );\n    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n    for (int i = 0; i < funcNames.count(); ++i) {\n        m_funcs[i] = f->vkGetDeviceProcAddr(device, funcNames.at(i));\n        if (i < %d && !m_funcs[i])\n            qWarning(\"QVulkanDeviceFunctions: Failed to resolve %%s\", funcNames.at(i));\n    }\n}\n\nQT_END_NAMESPACE\n"
                      ,pcVar9,pcVar8,pcVar7,(ulong)local_19c,local_148.ptr,local_160.ptr,local_190);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_160);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_148);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_130);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_118);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_100);
    QString::toUtf8_helper((QString *)&local_100);
    QIODevice::write(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_100);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool genVulkanFunctionsPC(const QList<VkSpecParser::Command> &commands,
                          const QMap<QString, QStringList> &versionCommandMapping,
                          const QString &licHeaderFn,
                          const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral("_p.cpp"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char s[] =
"%s\n"
"#include \"qvulkanfunctions_p.h\"\n"
"#include \"qvulkaninstance.h\"\n"
"\n"
"#include <QtCore/private/qoffsetstringarray_p.h>\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n%s"
"QVulkanFunctionsPrivate::QVulkanFunctionsPrivate(QVulkanInstance *inst)\n"
"{\n"
"    static constexpr auto funcNames = qOffsetStringArray(\n"
"%s\n"
"    );\n"
"    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n"
"    for (int i = 0; i < funcNames.count(); ++i) {\n"
"        m_funcs[i] = inst->getInstanceProcAddr(funcNames.at(i));\n"
"        if (i < %d && !m_funcs[i])\n"
"            qWarning(\"QVulkanFunctions: Failed to resolve %%s\", funcNames.at(i));\n"
"    }\n"
"}\n"
"\n%s"
"QVulkanDeviceFunctionsPrivate::QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device)\n"
"{\n"
"    QVulkanFunctions *f = inst->functions();\n"
"    Q_ASSERT(f);\n\n"
"    static constexpr auto funcNames = qOffsetStringArray(\n"
"%s\n"
"    );\n"
"    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n"
"    for (int i = 0; i < funcNames.count(); ++i) {\n"
"        m_funcs[i] = f->vkGetDeviceProcAddr(device, funcNames.at(i));\n"
"        if (i < %d && !m_funcs[i])\n"
"            qWarning(\"QVulkanDeviceFunctions: Failed to resolve %%s\", funcNames.at(i));\n"
"    }\n"
"}\n"
"\n"
"QT_END_NAMESPACE\n";

    QString devCmdWrapperStr;
    QString instCmdWrapperStr;
    int devIdx = 0;
    int instIdx = 0;
    QString devCmdNamesStr;
    QString instCmdNamesStr;
    int vulkan10DevCount = 0;
    int vulkan10InstCount = 0;

    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        instCmdWrapperStr += "\n#if " + version + "\n";
        devCmdWrapperStr += "\n#if " + version + "\n";
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            QString *dst = c.deviceLevel ? &devCmdWrapperStr : &instCmdWrapperStr;
            int *idx = c.deviceLevel ? &devIdx : &instIdx;
            *dst += funcSig(c, c.deviceLevel ? "QVulkanDeviceFunctions" : "QVulkanFunctions");
            *dst += QString(QStringLiteral("\n{\n    Q_ASSERT(d_ptr->m_funcs[%1]);\n    ")).arg(*idx);
            *dst += funcCall(c, *idx);
            *dst += QStringLiteral(";\n}\n\n");
            *idx += 1;

            dst = c.deviceLevel ? &devCmdNamesStr : &instCmdNamesStr;
            *dst += QStringLiteral("        \"");
            *dst += c.cmd.name;
            *dst += QStringLiteral("\",\n");
        }
        if (version == QStringLiteral("VK_VERSION_1_0")) {
            vulkan10InstCount = instIdx;
            vulkan10DevCount = devIdx;
        }
        instCmdWrapperStr += "#endif\n\n";
        devCmdWrapperStr += "#endif\n\n";
    }

    if (devCmdNamesStr.size() > 2)
        devCmdNamesStr.chop(2);
    if (instCmdNamesStr.size() > 2)
        instCmdNamesStr.chop(2);

    const QString str =
            QString::asprintf(s, preamble.get(licHeaderFn).constData(),
                              instCmdWrapperStr.toUtf8().constData(),
                              instCmdNamesStr.toUtf8().constData(), vulkan10InstCount,
                              devCmdWrapperStr.toUtf8().constData(),
                              devCmdNamesStr.toUtf8().constData(), vulkan10DevCount);

    f.write(str.toUtf8());

    return true;
}